

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

void * tc_valloc(size_t __size)

{
  int iVar1;
  void *p;
  size_t local_38;
  size_t local_30;
  undefined4 local_28;
  
  iVar1 = getpagesize();
  p = do_debug_memalign((long)iVar1,__size,-0x10325470);
  if (p == (void *)0x0) {
    local_28 = 0xefcdab90;
    local_38 = (long)iVar1;
    local_30 = __size;
    p = anon_unknown.dwarf_505b::handle_oom(retry_debug_memalign,&local_38,false,true);
  }
  if (base::internal::new_hooks_ != 0) {
    tcmalloc::InvokeNewHookSlow(p,__size);
  }
  return p;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_valloc(size_t size) PERFTOOLS_NOTHROW {
  // Allocate >= size bytes starting on a page boundary
  void *p = do_debug_memalign_or_debug_cpp_memalign(getpagesize(), size, MallocBlock::kMallocType, false, true);
  tcmalloc::InvokeNewHook(p, size);
  return p;
}